

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bfromcstralloc(int mlen,char *str)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  size_t j;
  int i;
  bstring b;
  char *str_local;
  bstring ptStack_10;
  int mlen_local;
  
  if (str == (char *)0x0) {
    ptStack_10 = (bstring)0x0;
  }
  else {
    sVar2 = strlen(str);
    iVar1 = (int)sVar2;
    j._4_4_ = snapUpSize(iVar1 + (2 - (uint)(sVar2 != 0)));
    if (iVar1 < j._4_4_) {
      ptStack_10 = (bstring)malloc(0x10);
      if (ptStack_10 == (bstring)0x0) {
        ptStack_10 = (bstring)0x0;
      }
      else {
        ptStack_10->slen = iVar1;
        if (j._4_4_ < mlen) {
          j._4_4_ = mlen;
        }
        ptStack_10->mlen = j._4_4_;
        puVar3 = (uchar *)malloc((long)j._4_4_);
        ptStack_10->data = puVar3;
        if (puVar3 == (uchar *)0x0) {
          free(ptStack_10);
          ptStack_10 = (bstring)0x0;
        }
        else {
          memcpy(ptStack_10->data,str,sVar2 + 1);
        }
      }
    }
    else {
      ptStack_10 = (bstring)0x0;
    }
  }
  return ptStack_10;
}

Assistant:

bstring bfromcstralloc (int mlen, const char * str) {
bstring b;
int i;
size_t j;

	if (str == NULL) return NULL;
	j = (strlen) (str);
	i = snapUpSize ((int) (j + (2 - (j != 0))));
	if (i <= (int) j) return NULL;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL;
	b->slen = (int) j;
	if (i < mlen) i = mlen;

	if (NULL == (b->data = (unsigned char *) bstr__alloc (b->mlen = i))) {
		bstr__free (b);
		return NULL;
	}

	bstr__memcpy (b->data, str, j+1);
	return b;
}